

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O0

void stbir__horizontal_gather_7_channels_with_4_coeffs
               (float *output_buffer,uint output_sub_size,float *decode_buffer,
               stbir__contributors *horizontal_contributors,float *horizontal_coefficients,
               int coefficient_width)

{
  undefined8 *puVar1;
  int *in_RCX;
  long in_RDX;
  int in_ESI;
  undefined8 *in_RDI;
  undefined8 *in_R8;
  int in_R9D;
  float *output_end;
  undefined8 *local_310;
  undefined8 *local_2f8;
  int *local_2f0;
  float fStack_1fc;
  float fStack_1f0;
  float fStack_1e4;
  float local_1d8;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  __m128 cs;
  __m128 c;
  __m128 tot3;
  __m128 tot2;
  __m128 tot1;
  __m128 tot0;
  float *hc;
  float *decode;
  float *output;
  
  local_310 = in_RDI;
  local_2f8 = in_R8;
  local_2f0 = in_RCX;
  do {
    puVar1 = (undefined8 *)(in_RDX + (long)(*local_2f0 * 7) * 4);
    local_1d8 = (float)*local_2f8;
    local_e8 = (float)*puVar1;
    fStack_e4 = (float)((ulong)*puVar1 >> 0x20);
    fStack_e0 = (float)puVar1[1];
    fStack_dc = (float)((ulong)puVar1[1] >> 0x20);
    local_108 = (float)*(undefined8 *)((long)puVar1 + 0xc);
    fStack_104 = (float)((ulong)*(undefined8 *)((long)puVar1 + 0xc) >> 0x20);
    fStack_100 = (float)*(undefined8 *)((long)puVar1 + 0x14);
    fStack_fc = (float)((ulong)*(undefined8 *)((long)puVar1 + 0x14) >> 0x20);
    fStack_1e4 = (float)((ulong)*local_2f8 >> 0x20);
    local_128 = (float)*(undefined8 *)((long)puVar1 + 0x1c);
    fStack_124 = (float)((ulong)*(undefined8 *)((long)puVar1 + 0x1c) >> 0x20);
    fStack_120 = (float)*(undefined8 *)((long)puVar1 + 0x24);
    fStack_11c = (float)((ulong)*(undefined8 *)((long)puVar1 + 0x24) >> 0x20);
    local_148 = (float)puVar1[5];
    fStack_144 = (float)((ulong)puVar1[5] >> 0x20);
    fStack_140 = (float)puVar1[6];
    fStack_13c = (float)((ulong)puVar1[6] >> 0x20);
    fStack_1f0 = (float)local_2f8[1];
    local_168 = (float)puVar1[7];
    fStack_164 = (float)((ulong)puVar1[7] >> 0x20);
    fStack_160 = (float)puVar1[8];
    fStack_15c = (float)((ulong)puVar1[8] >> 0x20);
    local_188 = (float)*(undefined8 *)((long)puVar1 + 0x44);
    fStack_184 = (float)((ulong)*(undefined8 *)((long)puVar1 + 0x44) >> 0x20);
    fStack_180 = (float)*(undefined8 *)((long)puVar1 + 0x4c);
    fStack_17c = (float)((ulong)*(undefined8 *)((long)puVar1 + 0x4c) >> 0x20);
    fStack_1fc = (float)((ulong)local_2f8[1] >> 0x20);
    local_1a8 = (float)*(undefined8 *)((long)puVar1 + 0x54);
    fStack_1a4 = (float)((ulong)*(undefined8 *)((long)puVar1 + 0x54) >> 0x20);
    fStack_1a0 = (float)*(undefined8 *)((long)puVar1 + 0x5c);
    fStack_19c = (float)((ulong)*(undefined8 *)((long)puVar1 + 0x5c) >> 0x20);
    local_1c8 = (float)puVar1[0xc];
    fStack_1c4 = (float)((ulong)puVar1[0xc] >> 0x20);
    fStack_1c0 = (float)puVar1[0xd];
    fStack_1bc = (float)((ulong)puVar1[0xd] >> 0x20);
    *(ulong *)((long)local_310 + 0xc) =
         CONCAT44(local_1d8 * fStack_104 + fStack_1f0 * fStack_184 +
                  fStack_1e4 * fStack_144 + fStack_1fc * fStack_1c4,
                  local_1d8 * local_108 + fStack_1f0 * local_188 +
                  fStack_1e4 * local_148 + fStack_1fc * local_1c8);
    *(ulong *)((long)local_310 + 0x14) =
         CONCAT44(local_1d8 * fStack_fc + fStack_1f0 * fStack_17c +
                  fStack_1e4 * fStack_13c + fStack_1fc * fStack_1bc,
                  local_1d8 * fStack_100 + fStack_1f0 * fStack_180 +
                  fStack_1e4 * fStack_140 + fStack_1fc * fStack_1c0);
    *local_310 = CONCAT44(local_1d8 * fStack_e4 + fStack_1f0 * fStack_164 +
                          fStack_1e4 * fStack_124 + fStack_1fc * fStack_1a4,
                          local_1d8 * local_e8 + fStack_1f0 * local_168 +
                          fStack_1e4 * local_128 + fStack_1fc * local_1a8);
    local_310[1] = CONCAT44(local_1d8 * fStack_dc + fStack_1f0 * fStack_15c +
                            fStack_1e4 * fStack_11c + fStack_1fc * fStack_19c,
                            local_1d8 * fStack_e0 + fStack_1f0 * fStack_160 +
                            fStack_1e4 * fStack_120 + fStack_1fc * fStack_1a0);
    local_2f8 = (undefined8 *)((long)local_2f8 + (long)in_R9D * 4);
    local_2f0 = local_2f0 + 2;
    local_310 = (undefined8 *)((long)local_310 + 0x1c);
  } while (local_310 < (undefined8 *)((long)in_RDI + (ulong)(uint)(in_ESI * 7) * 4));
  return;
}

Assistant:

static void STBIR_chans( stbir__horizontal_gather_,_channels_with_4_coeffs)( float * output_buffer, unsigned int output_sub_size, float const * decode_buffer, stbir__contributors const * horizontal_contributors, float const * horizontal_coefficients, int coefficient_width )
{
  float const * output_end = output_buffer + output_sub_size * STBIR__horizontal_channels;
  float STBIR_SIMD_STREAMOUT_PTR( * ) output = output_buffer;
  STBIR_SIMD_NO_UNROLL_LOOP_START
  do {
    float const * decode = decode_buffer + horizontal_contributors->n0 * STBIR__horizontal_channels;
    float const * hc = horizontal_coefficients;
    stbir__4_coeff_start();
    stbir__store_output();
  } while ( output < output_end );
}